

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

void Cudd_AutodynEnable(DdManager *unique,Cudd_ReorderingType method)

{
  DdNode **ppDVar1;
  
  unique->autoDyn = 1;
  if (method != CUDD_REORDER_SAME) {
    unique->autoMethod = method;
  }
  cuddClearDeathRow(unique);
  unique->deathRowDepth = 1;
  unique->deadMask = 0;
  if (unique->nextDead != 0) {
    unique->nextDead = 0;
  }
  if (unique->deathRow == (DdNode **)0x0) {
    ppDVar1 = (DdNode **)malloc(8);
  }
  else {
    ppDVar1 = (DdNode **)realloc(unique->deathRow,8);
  }
  unique->deathRow = ppDVar1;
  return;
}

Assistant:

void
Cudd_AutodynEnable(
  DdManager * unique,
  Cudd_ReorderingType  method)
{
    unique->autoDyn = 1;
    if (method != CUDD_REORDER_SAME) {
        unique->autoMethod = method;
    }
#ifndef DD_NO_DEATH_ROW
    /* If reordering is enabled, using the death row causes too many
    ** invocations. Hence, we shrink the death row to just one entry.
    */
    cuddClearDeathRow(unique);
    unique->deathRowDepth = 1;
    unique->deadMask = unique->deathRowDepth - 1;
    if ((unsigned) unique->nextDead > unique->deadMask) {
        unique->nextDead = 0;
    }
    unique->deathRow = ABC_REALLOC(DdNodePtr, unique->deathRow,
        unique->deathRowDepth);
#endif
    return;

}